

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenTypeExpand(BinaryenType t,BinaryenType *buf)

{
  bool bVar1;
  Type *this;
  TypeID TVar2;
  Type *type;
  Iterator __end1;
  Iterator __begin1;
  Type *__range1;
  size_t i;
  Type types;
  BinaryenType *buf_local;
  BinaryenType t_local;
  
  types.id = (uintptr_t)buf;
  wasm::Type::Type((Type *)&i,t);
  __range1 = (Type *)0x0;
  join_0x00000010_0x00000000_ =
       (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)wasm::Type::begin((Type *)&i);
  _type = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)wasm::Type::end((Type *)&i)
  ;
  while( true ) {
    bVar1 = wasm::ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                      ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                       &__end1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                        index,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)&type
                      );
    if (!bVar1) break;
    this = wasm::Type::Iterator::operator*
                     ((Iterator *)
                      &__end1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                       index);
    TVar2 = wasm::Type::getID(this);
    *(TypeID *)(types.id + (long)__range1 * 8) = TVar2;
    wasm::ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
              ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
               &__end1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index);
    __range1 = (Type *)((long)&__range1->id + 1);
  }
  return;
}

Assistant:

void BinaryenTypeExpand(BinaryenType t, BinaryenType* buf) {
  Type types(t);
  size_t i = 0;
  for (const auto& type : types) {
    buf[i++] = type.getID();
  }
}